

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h261.c
# Opt level: O2

int h261_picparm(bitstream *str,h261_picparm *picparm)

{
  uint in_EAX;
  int iVar1;
  int iVar2;
  uint uStack_28;
  uint32_t pei;
  
  uStack_28 = in_EAX;
  iVar1 = vs_u(str,&picparm->tr,5);
  iVar2 = 1;
  if (iVar1 == 0) {
    iVar1 = vs_u(str,&picparm->ptype,6);
    if (iVar1 == 0) {
      if ((picparm->ptype & 1) == 0) {
        fwrite("Spare bit unset - H.263 stream?\n",0x20,1,_stderr);
      }
      else {
        _uStack_28 = (ulong)uStack_28;
        iVar2 = 1;
        iVar1 = vs_u(str,&pei,1);
        if (iVar1 == 0) {
          while (pei != 0) {
            iVar2 = vs_u(str,&pei,8);
            if (iVar2 != 0) {
              return 1;
            }
            iVar2 = vs_u(str,&pei,1);
            if (iVar2 != 0) {
              return 1;
            }
          }
          iVar2 = 0;
        }
      }
    }
  }
  return iVar2;
}

Assistant:

int h261_picparm(struct bitstream *str, struct h261_picparm *picparm) {
	if (vs_u(str, &picparm->tr, 5)) return 1;
	if (vs_u(str, &picparm->ptype, 6)) return 1;
	if (!(picparm->ptype & 1)) {
		fprintf(stderr, "Spare bit unset - H.263 stream?\n");
		return 1;
	}
	uint32_t pei = 0;
	if (vs_u(str, &pei, 1)) return 1;
	while (pei) {
		if (vs_u(str, &pei, 8)) return 1;
		if (vs_u(str, &pei, 1)) return 1;
	}
	return 0;
}